

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unhexFunc(sqlite3_context *pCtx,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  int in_ESI;
  long in_FS_OFFSET;
  u32 ch;
  u8 d;
  u8 c;
  u8 *p;
  u8 *pBlob;
  int nHex;
  int nPass;
  u8 *zPass;
  u8 *zHex;
  int in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  uint uVar5;
  i64 nByte;
  sqlite3_context *psVar6;
  sqlite3_context *pCtx_00;
  int iVar7;
  uchar *local_30;
  byte *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = "";
  iVar7 = 0;
  local_10 = sqlite3_value_text((sqlite3_value *)0x2246b5);
  iVar2 = sqlite3_value_bytes((sqlite3_value *)0x2246c7);
  psVar6 = (sqlite3_context *)0x0;
  nByte = 0;
  if (in_ESI == 2) {
    local_30 = sqlite3_value_text((sqlite3_value *)0x2246f2);
    iVar7 = sqlite3_value_bytes((sqlite3_value *)0x224705);
  }
  if ((local_10 != (byte *)0x0) && (local_30 != (uchar *)0x0)) {
    psVar6 = (sqlite3_context *)contextMalloc(psVar6,nByte);
    pCtx_00 = psVar6;
    if (psVar6 != (sqlite3_context *)0x0) {
      uVar5 = (uint)CONCAT12(0xaa,(short)in_stack_ffffffffffffffb4);
      while (in_stack_ffffffffffffffb4 = CONCAT13(*local_10,(int3)uVar5), *local_10 != 0) {
        while (bVar1 = (byte)((uint)in_stack_ffffffffffffffb4 >> 0x18), (""[bVar1] & 8) == 0) {
          if (*local_10 < 0x80) {
            in_stack_ffffffffffffffac = (uint)*local_10;
            local_10 = local_10 + 1;
          }
          else {
            in_stack_ffffffffffffffac = sqlite3Utf8Read(&local_10);
          }
          iVar3 = strContainsChar((u8 *)CONCAT44(iVar7,iVar2),(int)((ulong)pCtx_00 >> 0x20),
                                  (u32)pCtx_00);
          if (iVar3 == 0) goto LAB_002248bd;
          in_stack_ffffffffffffffb4 = CONCAT13(*local_10,(int3)in_stack_ffffffffffffffb4);
          if (*local_10 == 0) goto LAB_00224896;
        }
        pbVar4 = local_10 + 1;
        local_10 = local_10 + 2;
        uVar5 = CONCAT13(bVar1,CONCAT12(*pbVar4,(short)in_stack_ffffffffffffffb4));
        if ((""[*pbVar4] & 8) == 0) {
LAB_002248bd:
          sqlite3_free((void *)0x2248c7);
          goto LAB_002248c7;
        }
        bVar1 = sqlite3HexToInt((uint)bVar1);
        in_stack_ffffffffffffffa8 = (uint)bVar1 << 4;
        bVar1 = sqlite3HexToInt(uVar5 >> 0x10 & 0xff);
        *(byte *)&psVar6->pOut = (byte)in_stack_ffffffffffffffa8 | bVar1;
        psVar6 = (sqlite3_context *)((long)&psVar6->pOut + 1);
      }
    }
LAB_00224896:
    sqlite3_result_blob(pCtx_00,psVar6,in_stack_ffffffffffffffb4,
                        (_func_void_void_ptr *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
LAB_002248c7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void unhexFunc(
  sqlite3_context *pCtx,
  int argc,
  sqlite3_value **argv
){
  const u8 *zPass = (const u8*)"";
  int nPass = 0;
  const u8 *zHex = sqlite3_value_text(argv[0]);
  int nHex = sqlite3_value_bytes(argv[0]);
#ifdef SQLITE_DEBUG
  const u8 *zEnd = zHex ? &zHex[nHex] : 0;
#endif
  u8 *pBlob = 0;
  u8 *p = 0;

  assert( argc==1 || argc==2 );
  if( argc==2 ){
    zPass = sqlite3_value_text(argv[1]);
    nPass = sqlite3_value_bytes(argv[1]);
  }
  if( !zHex || !zPass ) return;

  p = pBlob = contextMalloc(pCtx, (nHex/2)+1);
  if( pBlob ){
    u8 c;                         /* Most significant digit of next byte */
    u8 d;                         /* Least significant digit of next byte */

    while( (c = *zHex)!=0x00 ){
      while( !sqlite3Isxdigit(c) ){
        u32 ch = Utf8Read(zHex);
        assert( zHex<=zEnd );
        if( !strContainsChar(zPass, nPass, ch) ) goto unhex_null;
        c = *zHex;
        if( c==0x00 ) goto unhex_done;
      }
      zHex++;
      assert( *zEnd==0x00 );
      assert( zHex<=zEnd );
      d = *(zHex++);
      if( !sqlite3Isxdigit(d) ) goto unhex_null;
      *(p++) = (sqlite3HexToInt(c)<<4) | sqlite3HexToInt(d);
    }
  }

 unhex_done:
  sqlite3_result_blob(pCtx, pBlob, (p - pBlob), sqlite3_free);
  return;

 unhex_null:
  sqlite3_free(pBlob);
  return;
}